

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.h
# Opt level: O0

void __thiscall OutputStream::grow(OutputStream *this,size_t N)

{
  char *pcVar1;
  size_t N_local;
  OutputStream *this_local;
  
  if (this->BufferCapacity <= N + this->CurrentPosition) {
    this->BufferCapacity = this->BufferCapacity << 1;
    if (this->BufferCapacity < N + this->CurrentPosition) {
      this->BufferCapacity = N + this->CurrentPosition;
    }
    pcVar1 = (char *)realloc(this->Buffer,this->BufferCapacity);
    this->Buffer = pcVar1;
    if (this->Buffer == (char *)0x0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

void grow(size_t N) {
    if (N + CurrentPosition >= BufferCapacity) {
      BufferCapacity *= 2;
      if (BufferCapacity < N + CurrentPosition)
        BufferCapacity = N + CurrentPosition;
      Buffer = static_cast<char *>(std::realloc(Buffer, BufferCapacity));
      if (Buffer == nullptr)
        std::terminate();
    }
  }